

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,4u>>(int bias)

{
  byte bVar1;
  int delta;
  ulong uVar2;
  Counter<unsigned_long,_64U> fullOriginal;
  ulong uVar3;
  uint uVar4;
  uint recent;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long absDiff;
  ulong uVar5;
  
  for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
    uVar4 = (uint)uVar3 & 0xf;
    uVar5 = (ulong)uVar4;
    for (uVar6 = 0; uVar6 != 0x20; uVar6 = uVar6 + 1) {
      if (uVar6 < uVar3) {
        if ((long)(uVar3 - uVar6) < (long)(8 - bias)) {
LAB_00102301:
          uVar2 = (ulong)((uint)uVar6 & 0x10 | uVar4);
          uVar7 = (ulong)((uint)uVar6 & 0xf);
          if (uVar7 < uVar5) {
            uVar8 = uVar2 - 0x10;
            if (uVar5 - uVar7 < 8U - (long)bias) {
              uVar8 = uVar2;
            }
          }
          else {
            uVar8 = uVar2 + 0x10;
            if (uVar7 - uVar5 <= (long)bias + 8U) {
              uVar8 = uVar2;
            }
          }
          if ((uVar8 != uVar3) ||
             ((bias == 0 &&
              (bVar1 = ((byte)uVar3 & 0xf) - (char)uVar6,
              ((bVar1 & 0xf) + uVar6) - (ulong)(bVar1 * '\x02' & 0x10) != uVar3))))
          goto LAB_00102373;
        }
      }
      else if ((long)(uVar6 - uVar3) <= (long)(bias + 8)) goto LAB_00102301;
    }
  }
LAB_00102373:
  return 0x1f < uVar3;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}